

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O0

bool Image_Function::IsEqual
               (Image *in1,uint32_t startX1,uint32_t startY1,Image *in2,uint32_t startX2,
               uint32_t startY2,uint32_t width,uint32_t height)

{
  byte bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uchar *puVar4;
  uchar *puVar5;
  uchar *puVar6;
  uchar *puVar7;
  uchar *puVar8;
  ImageTemplate<unsigned_char> *in_RCX;
  int in_EDX;
  int in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  uint8_t *in1XEnd;
  uint8_t *in2X;
  uint8_t *in1X;
  uint8_t *in1YEnd;
  uint8_t *in2Y;
  uint8_t *in1Y;
  uint32_t rowSize2;
  uint32_t rowSize1;
  uint8_t colorCount;
  int iVar9;
  undefined4 in_stack_ffffffffffffff3c;
  int iVar10;
  undefined4 in_stack_ffffffffffffff44;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff48;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff70;
  uint32_t in_stack_ffffffffffffff80;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  uint32_t *in_stack_ffffffffffffffa0;
  
  iVar9 = in_stack_00000008;
  iVar10 = in_stack_00000010;
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_ffffffffffffff70,(uint32_t)((ulong)in_stack_ffffffffffffff68 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
             (uint32_t)((ulong)in_stack_ffffffffffffff58 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff58,in_stack_ffffffffffffff80,
             (uint32_t)in_stack_ffffffffffffff88);
  bVar1 = CommonColorCount<PenguinV_Image::ImageTemplate<unsigned_char>>
                    (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff44,iVar10),
             (ImageTemplate<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff3c,iVar9));
  OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_ffffffffffffffa0,
             (uint32_t *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             (ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),in_stack_ffffffffffffff88
            );
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x11c9d4);
  uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RDI);
  uVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RCX);
  puVar4 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RDI);
  puVar4 = puVar4 + (ulong)(in_ESI * (uint)bVar1) + (ulong)(in_EDX * uVar2);
  puVar5 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RCX);
  puVar5 = puVar5 + (ulong)(in_R8D * (uint)bVar1) + (ulong)(in_R9D * uVar3);
  puVar6 = puVar4 + in_stack_00000010 * uVar2;
  do {
    if (puVar4 == puVar6) {
      return true;
    }
    puVar8 = puVar5;
    for (puVar7 = puVar4; puVar7 != puVar4 + in_stack_00000008 * (uint)bVar1; puVar7 = puVar7 + 1) {
      if (*puVar7 != *puVar8) {
        return false;
      }
      puVar8 = puVar8 + 1;
    }
    puVar4 = puVar4 + uVar2;
    puVar5 = puVar5 + uVar3;
  } while( true );
}

Assistant:

bool IsEqual( const Image & in1, uint32_t startX1, uint32_t startY1, const Image & in2, uint32_t startX2, uint32_t startY2,
                  uint32_t width, uint32_t height )
    {
        ParameterValidation( in1, startX1, startY1, in2, startX2, startY2, width, height );

        const uint8_t colorCount = CommonColorCount( in1, in2 );
        width = width * colorCount;

        OptimiseRoi( width, height, in1, in2 );

        const uint32_t rowSize1  = in1.rowSize();
        const uint32_t rowSize2  = in2.rowSize();

        const uint8_t * in1Y = in1.data() + startY1 * rowSize1 + startX1 * colorCount;
        const uint8_t * in2Y = in2.data() + startY2 * rowSize2 + startX2 * colorCount;

        const uint8_t * in1YEnd = in1Y + height * rowSize1;

        for( ; in1Y != in1YEnd; in1Y += rowSize1, in2Y += rowSize2 ) {
            const uint8_t * in1X = in1Y;
            const uint8_t * in2X = in2Y;
            const uint8_t * in1XEnd = in1X + width;

            for( ; in1X != in1XEnd; ++in1X, ++in2X ) {
                if( (*in1X) != (*in2X) )
                    return false;
            }
        }

        return true;
    }